

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_stderr.c
# Opt level: O3

void tool_set_stderr_file(GlobalConfig *global,char *filename)

{
  FILE *pFVar1;
  FILE *pFVar2;
  
  pFVar1 = (FILE *)tool_stderr;
  if ((filename != (char *)0x0) &&
     ((*filename != '-' || (pFVar1 = (FILE *)_stdout, filename[1] != '\0')))) {
    pFVar1 = fopen64(filename,"w");
    if (pFVar1 == (FILE *)0x0) {
      warnf(global,"Warning: Failed to open %s",filename);
      return;
    }
    fclose(pFVar1);
    pFVar2 = freopen64(filename,"w",_stderr);
    pFVar1 = _stderr;
    if (pFVar2 == (FILE *)0x0) {
      return;
    }
  }
  tool_stderr = (FILE *)pFVar1;
  return;
}

Assistant:

void tool_set_stderr_file(struct GlobalConfig *global, const char *filename)
{
  FILE *fp;

  if(!filename)
    return;

  if(!strcmp(filename, "-")) {
    tool_stderr = stdout;
    return;
  }

  /* precheck that filename is accessible to lessen the chance that the
     subsequent freopen will fail. */
  fp = fopen(filename, FOPEN_WRITETEXT);
  if(!fp) {
    warnf(global, "Warning: Failed to open %s", filename);
    return;
  }
  fclose(fp);

  /* freopen the actual stderr (stdio.h stderr) instead of tool_stderr since
     the latter may be set to stdout. */
  /* !checksrc! disable STDERR 1 */
  fp = freopen(filename, FOPEN_WRITETEXT, stderr);
  if(!fp) {
    /* stderr may have been closed by freopen. there is nothing to be done. */
    DEBUGASSERT(0);
    return;
  }
  /* !checksrc! disable STDERR 1 */
  tool_stderr = stderr;
}